

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O1

int sys_parsedevlist(int *np,int *vecp,int max,char *str)

{
  char *in_RAX;
  long lVar1;
  int iVar2;
  bool bVar3;
  char *endp;
  char *local_38;
  
  iVar2 = 0;
  local_38 = in_RAX;
  do {
    if ((max <= iVar2) || (*str == '\0')) break;
    lVar1 = strtol(str,&local_38,10);
    vecp[iVar2] = (int)lVar1;
    if (local_38 == str) {
      bVar3 = false;
    }
    else {
      iVar2 = iVar2 + 1;
      bVar3 = *local_38 != '\0';
      if (bVar3) {
        str = local_38 + 1;
      }
    }
  } while (bVar3);
  *np = iVar2;
  return iVar2;
}

Assistant:

static int sys_parsedevlist(int *np, int *vecp, int max, const char *str)
{
    int n = 0;
    while (n < max)
    {
        if (! *str) break;
        else
        {
            char *endp;
            vecp[n] = (int)strtol(str, &endp, 10);
            if (endp == str)
                break;
            n++;
            if (! *endp)
                break;
            str = endp + 1;
        }
    }
    return (*np = n);
}